

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_sched_perf.cpp
# Opt level: O0

void process_arguments(int argc,char **argv)

{
  unsigned_long *puVar1;
  ulong uVar2;
  char **in_RSI;
  int in_EDI;
  int c;
  ulong local_20;
  uint local_14;
  char **local_10;
  int local_4;
  
  local_10 = in_RSI;
  local_4 = in_EDI;
  while (local_14 = getopt(local_4,local_10,"chN:n:pq:sT:t:v:"), local_14 != 0xffffffff) {
    switch(local_14) {
    case 0x4e:
      uVar2 = strtoul(_optarg,(char **)0x0,0);
      local_14 = (uint)uVar2;
      if (local_14 < 0x4000) {
        MaxNTasks = (size_t)(int)local_14;
      }
      break;
    default:
      fprintf(_stderr,"Unknown argument %c. Try -h\n",(ulong)(uint)(int)(char)local_14);
      break;
    case 0x50:
      OnlyParallelRun = true;
      break;
    case 0x54:
      local_20 = strtoul(_optarg,(char **)0x0,0);
      puVar1 = std::min<unsigned_long>(&local_20,&MAX_NTASKS);
      MaxTileSize = *puVar1;
      break;
    case 99:
      ClearCaches = true;
      break;
    case 0x68:
      show_help();
      exit(0);
    case 0x6e:
      uVar2 = strtoul(_optarg,(char **)0x0,0);
      NReps = (int)uVar2;
      break;
    case 0x70:
      ParallelBaseline = true;
      break;
    case 0x71:
      uVar2 = strtoul(_optarg,(char **)0x0,0);
      Queue_limit = (int)uVar2;
      break;
    case 0x73:
      UseSameTile = true;
      break;
    case 0x74:
      uVar2 = strtoul(_optarg,(char **)0x0,0);
      Nthreads = (int)uVar2;
      break;
    case 0x76:
      uVar2 = strtoul(_optarg,(char **)0x0,0);
      Verbosity = (int)uVar2;
    }
  }
  return;
}

Assistant:

void process_arguments(int argc, char **argv)
{ int c;

  while ( -1 != (c = getopt(argc, argv, "chN:n:pq:sT:t:v:")) ) {
    switch (c) {
      case 'c':
        ClearCaches = true;
        break;
      case 'h':
        show_help();
        exit(0);
        break;
      case 'N':
        c = strtoul(optarg, 0, 0);
        if (c < MAX_NTASKS) {
          MaxNTasks = c;
        }
        break;
      case 'n':
        NReps = strtoul(optarg, 0, 0);
        break;
      case 'P':
        OnlyParallelRun = true;
        break;
      case 'p':
        ParallelBaseline = true;
        break;
      case 'q' : /* queue limit */
        Queue_limit = strtoul(optarg, 0, 0);
        break;
      case 's':
        UseSameTile = true;
        break;
      case 'T':
        MaxTileSize = std::min(strtoul(optarg, 0, 0), MAX_NTASKS);
        break;
      case 't':
        Nthreads = strtoul(optarg, 0, 0);
        break;
      case 'v':
        Verbosity = strtoul(optarg, 0, 0);
        break;
      default:
        fprintf(stderr, "Unknown argument %c. Try -h\n", (char)c);
    }
  }
}